

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

bool __thiscall cmCTestHG::StatusParser::ProcessLine(StatusParser *this)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  byte *local_30;
  undefined8 local_28;
  byte local_20;
  undefined7 uStack_1f;
  
  bVar3 = cmsys::RegularExpression::find
                    (&this->RegexStatus,(this->super_LineParser).Line._M_dataplus._M_p);
  if (bVar3) {
    pcVar2 = (this->RegexStatus).startp[1];
    if (pcVar2 == (char *)0x0) {
      local_30 = &local_20;
      local_28 = 0;
      local_20 = 0;
    }
    else {
      local_30 = &local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar2,(this->RegexStatus).endp[1]);
    }
    bVar1 = *local_30;
    pcVar2 = (this->RegexStatus).startp[2];
    if (pcVar2 == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar2,(this->RegexStatus).endp[2]);
    }
    if (((local_48 != 0) && (bVar1 - 0x21 < 0x32)) &&
       ((0x2100100000001U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) != 0)) {
      (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])(this->HG,1,&local_50);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexStatus.find(this->Line))
      {
      this->DoPath(this->RegexStatus.match(1)[0],
                   this->RegexStatus.match(2));
      }
    return true;
    }